

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  string *config;
  pointer lang;
  allocator local_46d;
  mode_t perm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  auto_ptr<cmCompiledGeneratorExpression> inputExpression;
  cmGeneratorExpression contentGE;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigs;
  string inputContent;
  string local_3d0;
  cmListFileBacktrace lfbt;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  outputFiles;
  
  perm = 0;
  inputContent._M_dataplus._M_p = (pointer)&inputContent.field_2;
  inputContent._M_string_length = 0;
  inputContent.field_2._M_local_buf[0] = '\0';
  if (this->InputIsContent == true) {
    std::__cxx11::string::_M_assign((string *)&inputContent);
  }
  else {
    std::__cxx11::string::string((string *)&contentGE,(string *)this);
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)&contentGE);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath((string *)&outputFiles,(string *)&contentGE);
    }
    else {
      FixRelativePath((string *)&outputFiles,this,(string *)&contentGE,PathForInput,lg);
    }
    std::__cxx11::string::operator=((string *)&contentGE,(string *)&outputFiles);
    std::__cxx11::string::~string((string *)&outputFiles);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lg->Makefile->ListFiles,(value_type *)&contentGE);
    cmsys::SystemTools::GetPermissions((char *)contentGE.Backtrace.Bottom.State,&perm);
    std::ifstream::ifstream(&outputFiles,(char *)contentGE.Backtrace.Bottom.State,_S_in);
    uVar1 = *(uint *)((long)&outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                     *(long *)(outputFiles._M_t._M_impl._0_8_ + -0x18));
    if ((uVar1 & 5) == 0) {
      lfbt.Bottom.State = (cmState *)&lfbt.Bottom.Position.Position;
      lfbt.Bottom.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
      lfbt.Bottom.Position.Position._0_1_ = 0;
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&enabledLanguages.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)enabledLanguages.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&outputFiles,(string *)&lfbt,(bool *)0x0,-1), bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &allConfigs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &enabledLanguages,(string *)&lfbt);
        std::__cxx11::string::append((string *)&inputContent);
        std::__cxx11::string::~string((string *)&allConfigs);
        std::__cxx11::string::assign((char *)&enabledLanguages);
      }
      std::__cxx11::string::append((string *)&inputContent);
      std::__cxx11::string::~string((string *)&enabledLanguages);
      std::__cxx11::string::~string((string *)&lfbt);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfbt);
      poVar3 = std::operator<<((ostream *)&lfbt,"Evaluation file \"");
      poVar3 = std::operator<<(poVar3,(string *)&contentGE);
      std::operator<<(poVar3,"\" cannot be read.");
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)&enabledLanguages);
      std::__cxx11::string::~string((string *)&enabledLanguages);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfbt);
    }
    std::ifstream::~ifstream(&outputFiles);
    std::__cxx11::string::~string((string *)&contentGE);
    if ((uVar1 & 5) != 0) goto LAB_00453800;
  }
  cmListFileBacktrace::cmListFileBacktrace(&lfbt,&((this->OutputFileExpr).x_)->Backtrace);
  cmGeneratorExpression::cmGeneratorExpression(&contentGE,&lfbt);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&outputFiles,(string *)&contentGE);
  inputExpression.x_ = (cmCompiledGeneratorExpression *)outputFiles._M_t._M_impl._0_8_;
  outputFiles._M_t._M_impl._0_8_ = 0;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&outputFiles);
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &outputFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  allConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  allConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cmMakefile::GetConfigurations(&local_3d0,lg->Makefile,&allConfigs,true);
  std::__cxx11::string::~string((string *)&local_3d0);
  if (allConfigs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      allConfigs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&enabledLanguages,"",&local_46d);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&allConfigs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &enabledLanguages);
    std::__cxx11::string::~string((string *)&enabledLanguages);
  }
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGlobalGenerator::GetEnabledLanguages(lg->GlobalGenerator,&enabledLanguages);
  for (lang = enabledLanguages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      config = allConfigs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lang != enabledLanguages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; lang = lang + 1) {
    while (config != allConfigs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
      Generate(this,lg,config,lang,inputExpression.x_,&outputFiles,perm);
      bVar2 = cmSystemTools::GetFatalErrorOccured();
      config = config + 1;
      if (bVar2) goto LAB_004537be;
    }
  }
LAB_004537be:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&enabledLanguages);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&allConfigs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&outputFiles._M_t);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&inputExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&contentGE);
  cmListFileBacktrace::~cmListFileBacktrace(&lfbt);
LAB_00453800:
  std::__cxx11::string::~string((string *)&inputContent);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(cmLocalGenerator* lg)
{
  mode_t perm = 0;
  std::string inputContent;
  if (this->InputIsContent) {
    inputContent = this->Input;
  } else {
    std::string inputFileName = this->Input;
    if (cmSystemTools::FileIsFullPath(inputFileName)) {
      inputFileName = cmSystemTools::CollapseFullPath(inputFileName);
    } else {
      inputFileName = this->FixRelativePath(inputFileName, PathForInput, lg);
    }
    lg->GetMakefile()->AddCMakeDependFile(inputFileName);
    cmSystemTools::GetPermissions(inputFileName.c_str(), perm);
    cmsys::ifstream fin(inputFileName.c_str());
    if (!fin) {
      std::ostringstream e;
      e << "Evaluation file \"" << inputFileName << "\" cannot be read.";
      lg->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
    }

    std::string line;
    std::string sep;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      inputContent += sep + line;
      sep = "\n";
    }
    inputContent += sep;
  }

  cmListFileBacktrace lfbt = this->OutputFileExpr->GetBacktrace();
  cmGeneratorExpression contentGE(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> inputExpression =
    contentGE.Parse(inputContent);

  std::map<std::string, std::string> outputFiles;

  std::vector<std::string> allConfigs;
  lg->GetMakefile()->GetConfigurations(allConfigs);

  if (allConfigs.empty()) {
    allConfigs.push_back("");
  }

  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator* gg = lg->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for (std::vector<std::string>::const_iterator le = enabledLanguages.begin();
       le != enabledLanguages.end(); ++le) {
    for (std::vector<std::string>::const_iterator li = allConfigs.begin();
         li != allConfigs.end(); ++li) {
      this->Generate(lg, *li, *le, inputExpression.get(), outputFiles, perm);
      if (cmSystemTools::GetFatalErrorOccured()) {
        return;
      }
    }
  }
}